

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::IncludeScope::IncludeScope
          (IncludeScope *this,cmMakefile *mf,string *filenametoread,bool noPolicyScope)

{
  cmMakefile *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _WordT _Var2;
  _WordT _Var3;
  PolicyStatus PVar4;
  PolicyMap local_48;
  
  this->Makefile = mf;
  this->NoPolicyScope = noPolicyScope;
  this->CheckCMP0011 = false;
  this->ReportError = true;
  cmListFileBacktrace::Push((cmListFileBacktrace *)&local_48,(string *)&mf->Backtrace);
  _Var3 = local_48.Status.super__Base_bitset<5UL>._M_w[1];
  _Var2 = local_48.Status.super__Base_bitset<5UL>._M_w[0];
  pcVar1 = this->Makefile;
  local_48.Status.super__Base_bitset<5UL>._M_w[0] = 0;
  local_48.Status.super__Base_bitset<5UL>._M_w[1] = 0;
  this_00 = (pcVar1->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pcVar1->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2;
  (pcVar1->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((cmLinkedTree<cmStateDetail::SnapshotDataType> *)
      local_48.Status.super__Base_bitset<5UL>._M_w[1] !=
      (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.Status.super__Base_bitset<5UL>._M_w[1]);
  }
  PushFunctionBlockerBarrier(this->Makefile);
  cmState::CreateIncludeFileSnapshot
            ((cmStateSnapshot *)&local_48,this->Makefile->GlobalGenerator->CMakeInstance->State,
             &this->Makefile->StateSnapshot,filenametoread);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_48.Status.super__Base_bitset<5UL>._M_w[2];
  (pcVar1->StateSnapshot).State = (cmState *)local_48.Status.super__Base_bitset<5UL>._M_w[0];
  (pcVar1->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
       local_48.Status.super__Base_bitset<5UL>._M_w[1];
  if (this->NoPolicyScope == false) {
    PVar4 = cmStateSnapshot::GetPolicy(&this->Makefile->StateSnapshot,CMP0011,false);
    switch(PVar4) {
    case OLD:
      this->NoPolicyScope = true;
      break;
    case WARN:
      local_48.Status.super__Base_bitset<5UL>._M_w[2] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[3] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[0] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[1] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[4] = 0;
      cmStateSnapshot::PushPolicy(&this->Makefile->StateSnapshot,&local_48,true);
      this->CheckCMP0011 = true;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      this->CheckCMP0011 = true;
    case NEW:
      local_48.Status.super__Base_bitset<5UL>._M_w[2] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[3] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[0] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[1] = 0;
      local_48.Status.super__Base_bitset<5UL>._M_w[4] = 0;
      cmStateSnapshot::PushPolicy(&this->Makefile->StateSnapshot,&local_48,false);
    }
  }
  return;
}

Assistant:

cmMakefile::IncludeScope::IncludeScope(cmMakefile* mf,
                                       std::string const& filenametoread,
                                       bool noPolicyScope)
  : Makefile(mf)
  , NoPolicyScope(noPolicyScope)
  , CheckCMP0011(false)
  , ReportError(true)
{
  this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

  this->Makefile->PushFunctionBlockerBarrier();

  this->Makefile->StateSnapshot =
    this->Makefile->GetState()->CreateIncludeFileSnapshot(
      this->Makefile->StateSnapshot, filenametoread);
  if (!this->NoPolicyScope) {
    // Check CMP0011 to determine the policy scope type.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011)) {
      case cmPolicies::WARN:
        // We need to push a scope to detect whether the script sets
        // any policies that would affect the includer and therefore
        // requires a warning.  We use a weak scope to simulate OLD
        // behavior by allowing policy changes to affect the includer.
        this->Makefile->PushPolicy(true);
        this->CheckCMP0011 = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to not push a scope at all.
        this->NoPolicyScope = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        // We should never make this policy required, but we handle it
        // here just in case.
        this->CheckCMP0011 = true;
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to push a (strong) scope.
        this->Makefile->PushPolicy();
        break;
    }
  }
}